

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__wrap_t____gles_sampler_wrap
          (ColladaParserAutoGen14Private *this)

{
  byte bVar1;
  bool bVar2;
  ENUM__gles_sampler_wrap EVar3;
  _func_unsigned_long_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *in_RDI;
  pair<unsigned_long,_COLLADASaxFWL14::ENUM__gles_sampler_wrap> *unaff_retaddr;
  bool *in_stack_00000008;
  ParserChar *in_stack_00000010;
  bool returnValue;
  ENUM__gles_sampler_wrap parameter;
  bool failed;
  ParserChar *in_stack_000000c8;
  ParserChar *in_stack_000000d0;
  StringHash in_stack_000000d8;
  ErrorType in_stack_000000e0;
  Severity in_stack_000000e4;
  ParserTemplateBase *in_stack_000000e8;
  bool local_11;
  uint in_stack_fffffffffffffff4;
  
  EVar3 = GeneratedSaxParser::Utils::
          toEnum<COLLADASaxFWL14::ENUM__gles_sampler_wrap,_unsigned_long,_(COLLADASaxFWL14::ENUM__gles_sampler_wrap)4>
                    (_parameter,in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  if ((in_stack_fffffffffffffff4 & 0x1000000) == 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x108) + 0x15d8))(*(long **)(in_RDI + 0x108),EVar3);
  }
  else {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      (in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,in_stack_000000d8,
                       in_stack_000000d0,in_stack_000000c8);
    bVar1 = bVar2 ^ 0xff;
  }
  local_11 = (bool)(bVar1 & 1);
  if (*(long *)(in_RDI + 0x90) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              ((StackMemoryManager *)CONCAT44(in_stack_fffffffffffffff4,EVar3));
  }
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  return local_11;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__wrap_t____gles_sampler_wrap()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__wrap_t____gles_sampler_wrap();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
ENUM__gles_sampler_wrap parameter = Utils::toEnum<ENUM__gles_sampler_wrap, StringHash, ENUM__gles_sampler_wrap__COUNT>((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed, ENUM__gles_sampler_wrapMap, Utils::calculateStringHash);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__wrap_t____gles_sampler_wrap(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_WRAP_T, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}